

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O0

void __thiscall tst_benchmark::valueReject(tst_benchmark *this)

{
  Logs *pLVar1;
  ulong uVar2;
  anon_class_1_0_00000001 local_31;
  QPromise<Data> local_30;
  QPromiseBase<Data> local_20;
  tst_benchmark *local_10;
  tst_benchmark *this_local;
  
  local_10 = this;
  pLVar1 = Logger::logs();
  Logs::reset(pLVar1);
  QtPromise::QPromise<Data>::QPromise<tst_benchmark::valueReject()::__0>(&local_30,&local_31);
  QtPromise::QPromiseBase<Data>::wait(&local_20,&local_30);
  QtPromise::QPromise<Data>::~QPromise((QPromise<Data> *)&local_20);
  QtPromise::QPromise<Data>::~QPromise(&local_30);
  pLVar1 = Logger::logs();
  uVar2 = QTest::qCompare(pLVar1->ctor,0,"Data::logs().ctor","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0x4c);
  if ((uVar2 & 1) != 0) {
    pLVar1 = Logger::logs();
    uVar2 = QTest::qCompare(pLVar1->copy,0,"Data::logs().copy","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                            ,0x4d);
    if ((uVar2 & 1) != 0) {
      pLVar1 = Logger::logs();
      uVar2 = QTest::qCompare(pLVar1->move,0,"Data::logs().move","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0x4e);
      if ((uVar2 & 1) != 0) {
        pLVar1 = Logger::logs();
        QTest::qCompare(pLVar1->refs,0,"Data::logs().refs","0",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                        ,0x4f);
      }
    }
  }
  return;
}

Assistant:

void tst_benchmark::valueReject()
{
    { // should not create any data if rejected
        Data::logs().reset();
        QtPromise::QPromise<Data>{[&](const QtPromise::QPromiseResolve<Data>&,
                                      const QtPromise::QPromiseReject<Data>& reject) {
            reject(QString{"foo"});
        }}.wait();

        QCOMPARE(Data::logs().ctor, 0);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
    }
}